

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore.hpp
# Opt level: O0

__pid_t __thiscall tlx::Semaphore::wait(Semaphore *this,void *__stat_loc)

{
  size_t sVar1;
  undefined8 in_RDX;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lock;
  size_t slack_local;
  size_t delta_local;
  Semaphore *this_local;
  
  lock._8_8_ = in_RDX;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,&this->mutex_);
  while (this->value_ < (ulong)((long)__stat_loc + lock._8_8_)) {
    std::condition_variable::wait((unique_lock *)&this->cv_);
  }
  this->value_ = this->value_ - (long)__stat_loc;
  sVar1 = this->value_;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return (__pid_t)sVar1;
}

Assistant:

size_t wait(size_t delta = 1, size_t slack = 0) {
        std::unique_lock<std::mutex> lock(mutex_);
        while (value_ < delta + slack)
            cv_.wait(lock);
        value_ -= delta;
        return value_;
    }